

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O3

void __thiscall Assimp::XFile::Node::~Node(Node *this)

{
  Node *this_00;
  Mesh *this_01;
  pointer pcVar1;
  bool bVar2;
  pointer ppNVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  pointer ppMVar7;
  
  ppNVar3 = (this->mChildren).
            super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mChildren).
      super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      this_00 = ppNVar3[uVar4];
      if (this_00 != (Node *)0x0) {
        ~Node(this_00);
      }
      operator_delete(this_00,0x98);
      ppNVar3 = (this->mChildren).
                super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->mChildren).
                                    super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3)
      ;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  ppMVar7 = (this->mMeshes).
            super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mMeshes).
      super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar7) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      this_01 = ppMVar7[uVar4];
      if (this_01 != (Mesh *)0x0) {
        Mesh::~Mesh(this_01);
      }
      operator_delete(this_01,600);
      ppMVar7 = (this->mMeshes).
                super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->mMeshes).
                                    super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar7 >> 3)
      ;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  if (ppMVar7 != (pointer)0x0) {
    operator_delete(ppMVar7,(long)(this->mMeshes).
                                  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar7
                   );
  }
  ppNVar3 = (this->mChildren).
            super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3,(long)(this->mChildren).
                                  super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar3
                   );
  }
  pcVar1 = (this->mName)._M_dataplus._M_p;
  paVar5 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Node() {
        for (unsigned int a = 0; a < mChildren.size(); ++a ) {
            delete mChildren[a];
        }
        for (unsigned int a = 0; a < mMeshes.size(); ++a) {
            delete mMeshes[a];
        }
    }